

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAddiEa<(moira::Instr)120,(moira::Mode)8,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char cVar8;
  Ea<(moira::Mode)8,_(moira::Size)2> dst;
  Ea<(moira::Mode)8,_(moira::Size)2> local_3c;
  
  *addr = *addr + 2;
  iVar4 = (*this->_vptr_Moira[5])();
  local_3c.reg = op & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  iVar5 = (*this->_vptr_Moira[5])(this);
  *addr = *addr + 2;
  uVar6 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = uVar6 & 0xffff | iVar5 << 0x10;
  bVar3 = str->upper;
  pcVar7 = "subi";
  if ((bool)bVar3 != false) {
    pcVar7 = "SUBI";
  }
  cVar8 = *pcVar7;
  if (cVar8 != '\0') {
    do {
      pcVar7 = pcVar7 + 1;
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar8;
      cVar8 = *pcVar7;
    } while (cVar8 != '\0');
    bVar3 = str->upper;
  }
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = '.';
  pbVar2 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (~bVar3 & 1) << 5 | 0x57;
  iVar5 = (this->tab).raw;
  while (pcVar7 = str->ptr, pcVar7 < str->base + iVar5) {
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  str->ptr = pcVar7 + 1;
  *pcVar7 = '#';
  StrWriter::operator<<(str,(Int)(int)(short)iVar4);
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ' ';
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmAddiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Ims      ( SEXT<S>(dasmRead<S>(addr)) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}